

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O2

void __thiscall
choc::value::Value::importStringHandles(choc::value::ValueView&,choc::value::
StringDictionary_const&)::StringHandleImporter::importStrings(choc::value::ValueView__
          (void *this,ValueView *v)

{
  MainType MVar1;
  StringDictionary *pSVar2;
  bool bVar3;
  int iVar4;
  uint32_t uVar5;
  undefined8 uVar6;
  uint32_t i;
  uint32_t index;
  Iterator __begin6;
  ValueView element;
  Iterator local_90;
  ValueView local_58;
  
  bVar3 = Type::usesStrings(&v->type);
  if (bVar3) {
    MVar1 = (v->type).mainType;
    if (MVar1 == object) {
      uVar5 = Type::getNumElements(&v->type);
      for (index = 0; uVar5 != index; index = index + 1) {
        ValueView::operator[](&local_90.value,v,index);
        ValueView__(this,&local_90.value);
        Type::deleteAllocatedObjects((Type *)&local_90);
      }
    }
    else if ((MVar1 == primitiveArray) || (MVar1 == complexArray)) {
      ValueView::begin(&local_90,v);
      for (; local_90.index != local_90.numElements; local_90.index = local_90.index + 1) {
        ValueView::Iterator::operator*(&local_58,&local_90);
        ValueView__(this,&local_58);
        Type::deleteAllocatedObjects(&local_58.type);
      }
      Type::deleteAllocatedObjects((Type *)&local_90);
    }
    else if (MVar1 == string) {
      pSVar2 = v->stringDictionary;
      uVar6 = (**(code **)(**this + 0x18))(*this,*(undefined4 *)v->data);
      iVar4 = (*pSVar2->_vptr_StringDictionary[2])(pSVar2,uVar6);
      *(int *)v->data = iVar4;
    }
  }
  return;
}

Assistant:

void importStrings (ValueView& v)
        {
            if (v.getType().usesStrings())
            {
                if (v.isString())
                {
                    auto oldHandle = StringDictionary::Handle { v.readContentAs<decltype (StringDictionary::Handle::handle)>() };
                    v.setUnchecked (v.stringDictionary->getHandleForString (oldDic.getStringForHandle (oldHandle)));
                }
                else if (v.isArray())
                {
                    for (auto element : v)
                        importStrings (element);
                }
                else if (v.isObject())
                {
                    auto numMembers = v.size();

                    for (uint32_t i = 0; i < numMembers; ++i)
                    {
                        auto member = v[i];
                        importStrings (member);
                    }
                }
            }
        }